

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int parseAndSaveValueTree
              (string *input,string *actual,string *kind,Features *features,bool parseOnly,
              Value *root)

{
  pointer pcVar1;
  bool bVar2;
  FILE *__stream;
  int iVar3;
  allocator local_169;
  string *local_168;
  string local_160;
  Reader reader;
  
  local_168 = actual;
  Json::Reader::Reader(&reader,features);
  iVar3 = 1;
  bVar2 = Json::Reader::parse(&reader,input,root,true);
  if (bVar2) {
    iVar3 = 0;
    if (!parseOnly) {
      __stream = fopen((local_168->_M_dataplus)._M_p,"wt");
      if (__stream == (FILE *)0x0) {
        printf("Failed to create %s actual file.\n",(kind->_M_dataplus)._M_p);
        iVar3 = 2;
      }
      else {
        std::__cxx11::string::string((string *)&local_160,".",&local_169);
        printValueTree((FILE *)__stream,root,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        fclose(__stream);
      }
    }
  }
  else {
    pcVar1 = (kind->_M_dataplus)._M_p;
    Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_160,&reader);
    printf("Failed to parse %s file: \n%s\n",pcVar1,local_160._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_160);
  }
  Json::Reader::~Reader(&reader);
  return iVar3;
}

Assistant:

static int parseAndSaveValueTree(const std::string& input,
                                 const std::string& actual,
                                 const std::string& kind,
                                 const Json::Features& features,
                                 bool parseOnly,
                                 Json::Value* root)
{
  Json::Reader reader(features);
  bool parsingSuccessful = reader.parse(input, *root);
  if (!parsingSuccessful) {
    printf("Failed to parse %s file: \n%s\n",
           kind.c_str(),
           reader.getFormattedErrorMessages().c_str());
    return 1;
  }
  if (!parseOnly) {
    FILE* factual = fopen(actual.c_str(), "wt");
    if (!factual) {
      printf("Failed to create %s actual file.\n", kind.c_str());
      return 2;
    }
    printValueTree(factual, *root);
    fclose(factual);
  }
  return 0;
}